

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

iterator * __thiscall
idx2::IncreaseCapacity<short,idx2::bitstream>
          (iterator *__return_storage_ptr__,idx2 *this,hash_table<short,_idx2::bitstream> *Ht,
          iterator *ItIn)

{
  char *pcVar1;
  bitstream *pbVar2;
  hash_table<short,_idx2::bitstream> *phVar3;
  i64 iVar4;
  iterator iVar5;
  long lVar6;
  long lVar7;
  bitstream *in_R8;
  hash_table<short,_idx2::bitstream> *local_a8;
  short *local_a0;
  idx2 *local_98;
  long local_90;
  iterator Result;
  hash_table<short,_idx2::bitstream> NewHt;
  
  pbVar2 = Ht->Vals;
  phVar3 = (hash_table<short,_idx2::bitstream> *)Ht->Stats;
  iVar4 = Ht->Size;
  __return_storage_ptr__->Key = Ht->Keys;
  __return_storage_ptr__->Val = pbVar2;
  __return_storage_ptr__->Ht = phVar3;
  __return_storage_ptr__->Idx = iVar4;
  NewHt.Keys = (short *)0x0;
  NewHt.LogCapacity = 0;
  NewHt.Alloc = (allocator *)0x0;
  NewHt.Vals = SUB328(ZEXT832(0),4);
  NewHt.Stats = (bucket_status *)NewHt.LogCapacity;
  NewHt.Size = (i64)NewHt.Alloc;
  Init<short,idx2::bitstream>(&NewHt,*(long *)(this + 0x20) + 1,*(allocator **)(this + 0x28));
  Begin<short,idx2::bitstream>((hash_table<short,_idx2::bitstream> *)this);
  while( true ) {
    if ((local_98 == this) && (local_90 == 1L << ((byte)this[0x20] & 0x3f))) break;
    Insert<short,idx2::bitstream>(&Result,(idx2 *)&NewHt,local_a8,local_a0,in_R8);
    if (*Ht->Keys == *Result.Key) {
      iVar5.Val = Result.Val;
      iVar5.Ht = Result.Ht;
      iVar5.Idx = Result.Idx;
      iVar5.Key = Result.Key;
      *__return_storage_ptr__ = iVar5;
    }
    lVar7 = local_90 * 2;
    lVar6 = local_90 * 0x30;
    do {
      lVar7 = lVar7 + 2;
      lVar6 = lVar6 + 0x30;
      pcVar1 = (char *)(*(long *)(local_98 + 0x10) + 1 + local_90);
      local_90 = local_90 + 1;
    } while (*pcVar1 != '\x02');
    local_a8 = (hash_table<short,_idx2::bitstream> *)(lVar7 + *(long *)local_98);
    local_a0 = (short *)(lVar6 + *(long *)(local_98 + 8));
  }
  Dealloc<short,idx2::bitstream>((hash_table<short,_idx2::bitstream> *)this);
  *(bucket_status **)(this + 0x10) = NewHt.Stats;
  *(i64 *)(this + 0x18) = NewHt.Size;
  *(i64 *)(this + 0x20) = NewHt.LogCapacity;
  *(allocator **)(this + 0x28) = NewHt.Alloc;
  *(short **)this = NewHt.Keys;
  *(bitstream **)(this + 8) = NewHt.Vals;
  *(bucket_status **)(this + 0x10) = NewHt.Stats;
  *(i64 *)(this + 0x18) = NewHt.Size;
  __return_storage_ptr__->Ht = (hash_table<short,_idx2::bitstream> *)this;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
IncreaseCapacity(hash_table<k, v>* Ht, const typename hash_table<k, v>::iterator& ItIn)
{
  auto ItOut = ItIn;
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
  {
    auto Result = Insert(&NewHt, *(It.Key), *(It.Val));
    if (*(ItIn.Key) == *(Result.Key))
      ItOut = Result;
  }
  Dealloc(Ht);
  *Ht = NewHt;
  ItOut.Ht = Ht;
  return ItOut;
}